

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::TraverseSchema
          (TraverseSchema *this,DOMElement *schemaRoot,XMLStringPool *uriStringPool,
          SchemaGrammar *schemaGrammar,GrammarResolver *grammarResolver,
          RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
          *cachedSchemaInfoList,
          RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *schemaInfoList,
          XMLScanner *xmlScanner,XMLCh *schemaURL,XMLEntityHandler *entityHandler,
          XMLErrorReporter *errorReporter,MemoryManager *manager,bool multipleImport)

{
  uint uVar1;
  MemoryManager *pMVar2;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar3;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *pRVar4;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar5;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *pRVar6;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar7;
  TraverseSchema *ctx;
  OutOfMemoryException *anon_var_0;
  undefined1 local_68 [8];
  CleanupType_conflict29 cleanup;
  bool multipleImport_local;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
  *cachedSchemaInfoList_local;
  GrammarResolver *grammarResolver_local;
  SchemaGrammar *schemaGrammar_local;
  XMLStringPool *uriStringPool_local;
  DOMElement *schemaRoot_local;
  TraverseSchema *this_local;
  
  XMemory::XMemory((XMemory *)this);
  this->fFullConstraintChecking = false;
  this->fTargetNSURI = -1;
  this->fEmptyNamespaceURI = -1;
  this->fCurrentScope = 0xfffffffe;
  uVar1 = SchemaGrammar::getScopeCount(schemaGrammar);
  this->fScopeCount = uVar1;
  uVar1 = SchemaGrammar::getAnonTypeCount(schemaGrammar);
  this->fAnonXSTypeCount = uVar1;
  this->fCircularCheckIndex = 0;
  this->fTargetNSURIString = (XMLCh *)0x0;
  this->fDatatypeRegistry = (DatatypeValidatorFactory *)0x0;
  this->fGrammarResolver = grammarResolver;
  this->fSchemaGrammar = schemaGrammar;
  this->fEntityHandler = entityHandler;
  this->fErrorReporter = errorReporter;
  this->fURIStringPool = uriStringPool;
  this->fStringPool = (XMLStringPool *)0x0;
  XMLBuffer::XMLBuffer(&this->fBuffer,0x3ff,manager);
  this->fScanner = xmlScanner;
  this->fAttributeDeclRegistry =
       (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)0x0;
  this->fComplexTypeRegistry =
       (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fGroupRegistry =
       (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fAttGroupRegistry =
       (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fIC_ElementsNS =
       (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        *)0x0;
  this->fPreprocessedNodes = (RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher> *)0x0;
  this->fSchemaInfo = (SchemaInfo *)0x0;
  this->fCurrentGroupInfo = (XercesGroupInfo *)0x0;
  this->fCurrentAttGroupInfo = (XercesAttGroupInfo *)0x0;
  this->fCurrentComplexType = (ComplexTypeInfo *)0x0;
  this->fCurrentTypeNameStack = (ValueVectorOf<unsigned_int> *)0x0;
  this->fCurrentGroupStack = (ValueVectorOf<unsigned_int> *)0x0;
  this->fIC_Elements = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
  this->fDeclStack = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0;
  this->fGlobalDeclarations = (ValueVectorOf<unsigned_int> **)0x0;
  this->fNonXSAttList = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0;
  this->fImportedNSList = (ValueVectorOf<int> *)0x0;
  this->fIC_NodeListNS =
       (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
        *)0x0;
  this->fNotationRegistry = (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0;
  this->fRedefineComponents = (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0;
  this->fIdentityConstraintNames =
       (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0;
  this->fValidSubstitutionGroups =
       (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        *)0x0;
  this->fSchemaInfoList = schemaInfoList;
  this->fCachedSchemaInfoList = cachedSchemaInfoList;
  this->fParser = (XSDDOMParser *)0x0;
  XSDErrorReporter::XSDErrorReporter(&this->fXSDErrorReporter,(XMLErrorReporter *)0x0);
  this->fLocator = (XSDLocator *)0x0;
  this->fMemoryManager = manager;
  pMVar2 = GrammarResolver::getGrammarPoolMemoryManager(this->fGrammarResolver);
  this->fGrammarPoolMemoryManager = pMVar2;
  this->fAnnotation = (XSAnnotation *)0x0;
  GeneralAttributeCheck::GeneralAttributeCheck(&this->fAttributeCheck,manager);
  ctx = this;
  JanitorMemFunCall<xercesc_4_0::TraverseSchema>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::TraverseSchema> *)local_68,this,(MFPT)cleanUp);
  if (((this->fGrammarResolver != (GrammarResolver *)0x0) && (schemaRoot != (DOMElement *)0x0)) &&
     (this->fURIStringPool != (XMLStringPool *)0x0)) {
    init(this,(EVP_PKEY_CTX *)ctx);
    if (multipleImport) {
      pRVar3 = SchemaGrammar::getComplexTypeRegistry(this->fSchemaGrammar);
      this->fComplexTypeRegistry = pRVar3;
      pRVar4 = SchemaGrammar::getGroupInfoRegistry(this->fSchemaGrammar);
      this->fGroupRegistry = pRVar4;
      pRVar5 = SchemaGrammar::getAttGroupInfoRegistry(this->fSchemaGrammar);
      this->fAttGroupRegistry = pRVar5;
      pRVar6 = SchemaGrammar::getAttributeDeclRegistry(this->fSchemaGrammar);
      this->fAttributeDeclRegistry = pRVar6;
      pRVar7 = SchemaGrammar::getValidSubstitutionGroups(this->fSchemaGrammar);
      this->fValidSubstitutionGroups = pRVar7;
    }
    preprocessSchema(this,schemaRoot,schemaURL,multipleImport);
    doTraverseSchema(this,schemaRoot);
    SchemaGrammar::setScopeCount(this->fSchemaGrammar,this->fScopeCount);
    SchemaGrammar::setAnonTypeCount(this->fSchemaGrammar,this->fAnonXSTypeCount);
  }
  JanitorMemFunCall<xercesc_4_0::TraverseSchema>::release
            ((JanitorMemFunCall<xercesc_4_0::TraverseSchema> *)local_68);
  JanitorMemFunCall<xercesc_4_0::TraverseSchema>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::TraverseSchema> *)local_68);
  return;
}

Assistant:

TraverseSchema::TraverseSchema( DOMElement* const    schemaRoot
                              , XMLStringPool* const   uriStringPool
                              , SchemaGrammar* const   schemaGrammar
                              , GrammarResolver* const grammarResolver
                              , RefHash2KeysTableOf<SchemaInfo>* cachedSchemaInfoList
                              , RefHash2KeysTableOf<SchemaInfo>* schemaInfoList
                              , XMLScanner* const      xmlScanner
                              , const XMLCh* const     schemaURL
                              , XMLEntityHandler* const  entityHandler
                              , XMLErrorReporter* const errorReporter
                              , MemoryManager* const    manager
                              , bool multipleImport)
    : fFullConstraintChecking(false)
    , fTargetNSURI(-1)
    , fEmptyNamespaceURI(-1)
    , fCurrentScope(Grammar::TOP_LEVEL_SCOPE)
    , fScopeCount(schemaGrammar->getScopeCount ())
    , fAnonXSTypeCount(schemaGrammar->getAnonTypeCount ())
    , fCircularCheckIndex(0)
    , fTargetNSURIString(0)
    , fDatatypeRegistry(0)
    , fGrammarResolver(grammarResolver)
    , fSchemaGrammar(schemaGrammar)
    , fEntityHandler(entityHandler)
    , fErrorReporter(errorReporter)
    , fURIStringPool(uriStringPool)
    , fStringPool(0)
    , fBuffer(1023, manager)
    , fScanner(xmlScanner)
    , fAttributeDeclRegistry(0)
    , fComplexTypeRegistry(0)
    , fGroupRegistry(0)
    , fAttGroupRegistry(0)
    , fIC_ElementsNS(0)
    , fPreprocessedNodes(0)
    , fSchemaInfo(0)
    , fCurrentGroupInfo(0)
    , fCurrentAttGroupInfo(0)
    , fCurrentComplexType(0)
    , fCurrentTypeNameStack(0)
    , fCurrentGroupStack(0)
    , fIC_Elements(0)
    , fDeclStack(0)
    , fGlobalDeclarations(0)
    , fNonXSAttList(0)
    , fImportedNSList(0)
    , fIC_NodeListNS(0)
    , fNotationRegistry(0)
    , fRedefineComponents(0)
    , fIdentityConstraintNames(0)
    , fValidSubstitutionGroups(0)
    , fSchemaInfoList(schemaInfoList)
    , fCachedSchemaInfoList (cachedSchemaInfoList)
    , fParser(0)
    , fLocator(0)
    , fMemoryManager(manager)
    , fGrammarPoolMemoryManager(fGrammarResolver->getGrammarPoolMemoryManager())
    , fAnnotation(0)
    , fAttributeCheck(manager)
{
    CleanupType cleanup(this, &TraverseSchema::cleanUp);

    try {

        if (fGrammarResolver && schemaRoot && fURIStringPool) {

            init();

            if (multipleImport)
            {
              // If we are working on an existing schema, do some
              // intitialization that is otherwise done by preprocessSchema.
              //
              fComplexTypeRegistry = fSchemaGrammar->getComplexTypeRegistry();
              fGroupRegistry = fSchemaGrammar->getGroupInfoRegistry();
              fAttGroupRegistry = fSchemaGrammar->getAttGroupInfoRegistry();
              fAttributeDeclRegistry = fSchemaGrammar->getAttributeDeclRegistry();
              fValidSubstitutionGroups = fSchemaGrammar->getValidSubstitutionGroups();
            }

            preprocessSchema(schemaRoot, schemaURL, multipleImport);
            doTraverseSchema(schemaRoot);

            // Store the scope and anon type counts in case we need to add
            // more to this grammar (multi-import case). schemaGrammar and
            // fSchemaGrammar should be the same here.
            //
            fSchemaGrammar->setScopeCount (fScopeCount);
            fSchemaGrammar->setAnonTypeCount (fAnonXSTypeCount);
        }

    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}